

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::DoSimdBinop<unsigned_int,unsigned_int>
          (Thread *this,BinopFunc<unsigned_int,_unsigned_int> *f)

{
  uint uVar1;
  u8 i;
  long lVar2;
  SR result;
  Simd<unsigned_int,_(unsigned_char)__x04_> lhs;
  Simd<unsigned_int,_(unsigned_char)__x04_> rhs;
  Value local_48;
  Value local_38;
  Value local_28;
  
  local_28 = Pop(this);
  local_38 = Pop(this);
  lVar2 = 0;
  do {
    uVar1 = (*f)(*(uint *)((long)&local_38 + lVar2 * 4),*(uint *)((long)&local_28 + lVar2 * 4));
    *(uint *)((long)&local_48 + lVar2 * 4) = uVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  Push(this,local_48);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdBinop(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto rhs = Pop<ST>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result.v[i] = f(lhs.v[i], rhs.v[i]);
  }
  Push(result);
  return RunResult::Ok;
}